

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IDisk.cpp
# Opt level: O3

void IDisk::FillTrack(uchar *track_buffer,uchar cylinder,DiskType type,uint sizeOftrack)

{
  unsigned_short uVar1;
  uint uVar2;
  uint uVar3;
  uchar uVar4;
  int iVar5;
  int iVar6;
  ulong uVar7;
  bool bVar8;
  CRC crc;
  long local_70;
  uchar *local_60;
  CRC local_58;
  
  uVar2 = 0;
  iVar6 = 0x50;
  do {
    uVar2 = AddByteToTrack(track_buffer,uVar2,'N',8,'\0');
    iVar6 = iVar6 + -1;
  } while (iVar6 != 0);
  iVar6 = 0;
  do {
    while (track_buffer == (uchar *)0x0) {
      uVar2 = uVar2 + 0x10;
      iVar6 = iVar6 + 1;
      if (iVar6 == 0xc) {
        local_60 = data_track;
        if (type == VENDOR) {
          local_60 = "AFBGCHDIE";
        }
LAB_00148cd2:
        uVar2 = uVar2 + 0x30;
LAB_00148cd5:
        uVar2 = AddByteToTrack(track_buffer,uVar2,0xfc,8,'\0');
        iVar6 = 0x32;
        do {
          uVar2 = AddByteToTrack(track_buffer,uVar2,'N',8,'\0');
          iVar6 = iVar6 + -1;
        } while (iVar6 != 0);
        local_70 = 0;
        do {
          CRC::CRC(&local_58);
          iVar6 = 0;
          do {
            if (track_buffer == (uchar *)0x0) {
              uVar2 = uVar2 + 0x10;
            }
            else {
              if (uVar2 == 0) {
                bVar8 = true;
              }
              else {
                bVar8 = track_buffer[uVar2 - 1] == '\0';
              }
              iVar5 = 8;
              do {
                track_buffer[uVar2] = bVar8;
                track_buffer[uVar2 + 1] = '\0';
                uVar2 = uVar2 + 2;
                bVar8 = true;
                iVar5 = iVar5 + -1;
              } while (iVar5 != 0);
            }
            CRC::AddByteToCrc(&local_58,'\0');
            iVar6 = iVar6 + 1;
          } while (iVar6 != 0xc);
          CRC::Reset(&local_58);
          if (track_buffer == (uchar *)0x0) {
            uVar2 = uVar2 + 0x10;
          }
          else {
            uVar3 = 0xf;
            do {
              track_buffer[uVar2] = (0x4489U >> (uVar3 & 0x1f) & 1) != 0;
              uVar2 = uVar2 + 1;
              bVar8 = uVar3 != 0;
              uVar3 = uVar3 - 1;
            } while (bVar8);
          }
          CRC::AddByteToCrc(&local_58,0xa1);
          if (track_buffer == (uchar *)0x0) {
            uVar2 = uVar2 + 0x10;
          }
          else {
            uVar3 = 0xf;
            do {
              track_buffer[uVar2] = (0x4489U >> (uVar3 & 0x1f) & 1) != 0;
              uVar2 = uVar2 + 1;
              bVar8 = uVar3 != 0;
              uVar3 = uVar3 - 1;
            } while (bVar8);
          }
          CRC::AddByteToCrc(&local_58,0xa1);
          if (track_buffer == (uchar *)0x0) {
            uVar2 = uVar2 + 0x10;
          }
          else {
            uVar3 = 0xf;
            do {
              track_buffer[uVar2] = (0x4489U >> (uVar3 & 0x1f) & 1) != 0;
              uVar2 = uVar2 + 1;
              bVar8 = uVar3 != 0;
              uVar3 = uVar3 - 1;
            } while (bVar8);
          }
          CRC::AddByteToCrc(&local_58,0xa1);
          uVar2 = AddByteToTrack(track_buffer,uVar2,0xfe,8,'\0');
          CRC::AddByteToCrc(&local_58,0xfe);
          uVar2 = AddByteToTrack(track_buffer,uVar2,cylinder,8,'\0');
          CRC::AddByteToCrc(&local_58,cylinder);
          if (track_buffer == (uchar *)0x0) {
            uVar2 = uVar2 + 0x10;
          }
          else {
            if (uVar2 == 0) {
              bVar8 = true;
            }
            else {
              bVar8 = track_buffer[uVar2 - 1] == '\0';
            }
            iVar6 = 8;
            do {
              track_buffer[uVar2] = bVar8;
              track_buffer[uVar2 + 1] = '\0';
              uVar2 = uVar2 + 2;
              bVar8 = true;
              iVar6 = iVar6 + -1;
            } while (iVar6 != 0);
          }
          CRC::AddByteToCrc(&local_58,'\0');
          uVar4 = local_60[local_70];
          uVar2 = AddByteToTrack(track_buffer,uVar2,uVar4,8,'\0');
          CRC::AddByteToCrc(&local_58,uVar4);
          uVar2 = AddByteToTrack(track_buffer,uVar2,'\x02',8,'\0');
          CRC::AddByteToCrc(&local_58,'\x02');
          uVar1 = local_58.computed_crc_;
          uVar4 = (uchar)(local_58.computed_crc_ >> 8);
          uVar2 = AddByteToTrack(track_buffer,uVar2,uVar4,8,'\0');
          CRC::AddByteToCrc(&local_58,uVar4);
          uVar2 = AddByteToTrack(track_buffer,uVar2,(uchar)uVar1,8,'\0');
          CRC::AddByteToCrc(&local_58,(uchar)uVar1);
          CRC::Reset(&local_58);
          iVar6 = 0x16;
          do {
            uVar2 = AddByteToTrack(track_buffer,uVar2,'N',8,'\0');
            CRC::AddByteToCrc(&local_58,'N');
            iVar6 = iVar6 + -1;
          } while (iVar6 != 0);
          iVar6 = 0;
          do {
            if (track_buffer == (uchar *)0x0) {
              uVar2 = uVar2 + 0x10;
            }
            else {
              if (uVar2 == 0) {
                bVar8 = true;
              }
              else {
                bVar8 = track_buffer[uVar2 - 1] == '\0';
              }
              iVar5 = 8;
              do {
                track_buffer[uVar2] = bVar8;
                track_buffer[uVar2 + 1] = '\0';
                uVar2 = uVar2 + 2;
                bVar8 = true;
                iVar5 = iVar5 + -1;
              } while (iVar5 != 0);
            }
            CRC::AddByteToCrc(&local_58,'\0');
            iVar6 = iVar6 + 1;
          } while (iVar6 != 0xc);
          CRC::Reset(&local_58);
          if (track_buffer == (uchar *)0x0) {
            uVar2 = uVar2 + 0x10;
          }
          else {
            uVar3 = 0xf;
            do {
              track_buffer[uVar2] = (0x4489U >> (uVar3 & 0x1f) & 1) != 0;
              uVar2 = uVar2 + 1;
              bVar8 = uVar3 != 0;
              uVar3 = uVar3 - 1;
            } while (bVar8);
          }
          CRC::AddByteToCrc(&local_58,0xa1);
          if (track_buffer == (uchar *)0x0) {
            uVar2 = uVar2 + 0x10;
          }
          else {
            uVar3 = 0xf;
            do {
              track_buffer[uVar2] = (0x4489U >> (uVar3 & 0x1f) & 1) != 0;
              uVar2 = uVar2 + 1;
              bVar8 = uVar3 != 0;
              uVar3 = uVar3 - 1;
            } while (bVar8);
          }
          CRC::AddByteToCrc(&local_58,0xa1);
          if (track_buffer == (uchar *)0x0) {
            uVar2 = uVar2 + 0x10;
          }
          else {
            uVar3 = 0xf;
            do {
              track_buffer[uVar2] = (0x4489U >> (uVar3 & 0x1f) & 1) != 0;
              uVar2 = uVar2 + 1;
              bVar8 = uVar3 != 0;
              uVar3 = uVar3 - 1;
            } while (bVar8);
          }
          CRC::AddByteToCrc(&local_58,0xa1);
          uVar2 = AddByteToTrack(track_buffer,uVar2,0xfb,8,'\0');
          CRC::AddByteToCrc(&local_58,0xfb);
          iVar6 = 0x200;
          do {
            uVar2 = AddByteToTrack(track_buffer,uVar2,0xe5,8,'\0');
            CRC::AddByteToCrc(&local_58,0xe5);
            uVar1 = local_58.computed_crc_;
            iVar6 = iVar6 + -1;
          } while (iVar6 != 0);
          uVar2 = AddByteToTrack(track_buffer,uVar2,(uchar)(local_58.computed_crc_ >> 8),8,'\0');
          uVar2 = AddByteToTrack(track_buffer,uVar2,(uchar)uVar1,8,'\0');
          iVar6 = 0x4e;
          do {
            uVar2 = AddByteToTrack(track_buffer,uVar2,'N',8,'\0');
            iVar6 = iVar6 + -1;
          } while (iVar6 != 0);
          CRC::~CRC(&local_58);
          local_70 = local_70 + 1;
        } while (local_70 != 9);
        for (; (int)uVar2 < 0x18691; uVar2 = AddByteToTrack(track_buffer,uVar2,'N',8,'\0')) {
        }
        if ((int)uVar2 < (int)sizeOftrack) {
          memset(track_buffer + uVar2,4,(ulong)(~uVar2 + sizeOftrack) + 1);
        }
        return;
      }
    }
    if (uVar2 == 0) {
      bVar8 = true;
    }
    else {
      bVar8 = track_buffer[uVar2 - 1] == '\0';
    }
    iVar5 = 8;
    do {
      track_buffer[uVar2] = bVar8;
      track_buffer[uVar2 + 1] = '\0';
      uVar2 = uVar2 + 2;
      bVar8 = true;
      iVar5 = iVar5 + -1;
    } while (iVar5 != 0);
    iVar6 = iVar6 + 1;
  } while (iVar6 != 0xc);
  local_60 = data_track;
  if (type == VENDOR) {
    local_60 = "AFBGCHDIE";
  }
  if (track_buffer != (uchar *)0x0) {
    uVar3 = 0xf;
    do {
      uVar7 = (ulong)uVar2;
      uVar2 = uVar2 + 1;
      track_buffer[uVar7] = (0x5224U >> (uVar3 & 0x1f) & 1) != 0;
      bVar8 = uVar3 != 0;
      uVar3 = uVar3 - 1;
    } while (bVar8);
    uVar3 = 0xf;
    do {
      uVar7 = (ulong)uVar2;
      uVar2 = uVar2 + 1;
      track_buffer[uVar7] = (0x5224U >> (uVar3 & 0x1f) & 1) != 0;
      bVar8 = uVar3 != 0;
      uVar3 = uVar3 - 1;
    } while (bVar8);
    uVar3 = 0xf;
    do {
      uVar7 = (ulong)uVar2;
      uVar2 = uVar2 + 1;
      track_buffer[uVar7] = (0x5224U >> (uVar3 & 0x1f) & 1) != 0;
      bVar8 = uVar3 != 0;
      uVar3 = uVar3 - 1;
    } while (bVar8);
    goto LAB_00148cd5;
  }
  goto LAB_00148cd2;
}

Assistant:

void IDisk::FillTrack(unsigned char* track_buffer, const unsigned char cylinder, IDisk::DiskType type,
                      unsigned int sizeOftrack)
{
   int j;
   int load_disk_index = 0;

   unsigned char* chrns;
   switch (type)
   {
   case VENDOR:
      chrns = vendor_track;
      break;
   case DATA:
   default:
      chrns = data_track;
      break;
   }

   // Fill the track :
   //  GAP 4a : 80 octets � #4E
   for (j = 0; j < 80; j++) load_disk_index = AddByteToTrack(track_buffer, load_disk_index, 0x4E);

   //  Sync : 12 octets � #00
   for (j = 0; j < 12; j++) load_disk_index = AddByteToTrack(track_buffer, load_disk_index, 0x00);

   //  IAM : 3 octets � #C2 + 1 octet � #FC
   load_disk_index = AddSyncByteToTrack(track_buffer, load_disk_index, 0xC2);
   load_disk_index = AddSyncByteToTrack(track_buffer, load_disk_index, 0xC2);
   load_disk_index = AddSyncByteToTrack(track_buffer, load_disk_index, 0xC2);
   load_disk_index = AddByteToTrack(track_buffer, load_disk_index, 0xFC);

   // GAP 1 : 50 byte with 0x4E value
   for (j = 0; j < 50; j++) load_disk_index = AddByteToTrack(track_buffer, load_disk_index, 0x4E);

   // Then, each sectors :
   for (unsigned int s = 0; s < 9; s++)
   {
      CRC crc;
      // - Sync : 12 byte, value #00
      for (j = 0; j < 12; j++) load_disk_index = IDisk::AddByteWithCrc(track_buffer, load_disk_index, 0x00, crc, false);

      crc.Reset();
      // - IDAM : 3 byte #A1 + 1 byte #FE
      load_disk_index = IDisk::AddByteWithCrc(track_buffer, load_disk_index, 0xA1, crc, true);
      load_disk_index = IDisk::AddByteWithCrc(track_buffer, load_disk_index, 0xA1, crc, true);
      load_disk_index = IDisk::AddByteWithCrc(track_buffer, load_disk_index, 0xA1, crc, true);
      load_disk_index = IDisk::AddByteWithCrc(track_buffer, load_disk_index, 0xFE, crc);

      // Index
      // - C (identification secteur 'C' = 1 byte)
      load_disk_index = IDisk::AddByteWithCrc(track_buffer, load_disk_index, cylinder, crc);
      // - H (identification secteur 'H' = 1 byte)
      load_disk_index = IDisk::AddByteWithCrc(track_buffer, load_disk_index, 0, crc);
      // - R (identification secteur 'R' = 1 byte)
      load_disk_index = IDisk::AddByteWithCrc(track_buffer, load_disk_index, chrns[s], crc);
      // - N (identification secteur 'N' = 1 byte)
      load_disk_index = IDisk::AddByteWithCrc(track_buffer, load_disk_index, 2, crc);

      unsigned short computed_crc = crc.GetCRC();
      load_disk_index = IDisk::AddByteWithCrc(track_buffer, load_disk_index, (computed_crc >> 8), crc);
      load_disk_index = IDisk::AddByteWithCrc(track_buffer, load_disk_index, (computed_crc & 0xFF), crc);

      crc.Reset();

      // - GAP 2 (22 bytes #4E)
      for (j = 0; j < 22; j++) load_disk_index = IDisk::AddByteWithCrc(track_buffer, load_disk_index, 0x4E, crc);

      // - Sync : 12 bytes #00
      for (j = 0; j < 12; j++) load_disk_index = IDisk::AddByteWithCrc(track_buffer, load_disk_index, 0x00, crc);

      crc.Reset();
      // - DATA AM : 3 bytes #A1 + 1 bytes #FB ou #F8
      load_disk_index = IDisk::AddByteWithCrc(track_buffer, load_disk_index, 0xA1, crc, true);
      load_disk_index = IDisk::AddByteWithCrc(track_buffer, load_disk_index, 0xA1, crc, true);
      load_disk_index = IDisk::AddByteWithCrc(track_buffer, load_disk_index, 0xA1, crc, true);
      load_disk_index = IDisk::AddByteWithCrc(track_buffer, load_disk_index, DAAM_OFF, crc);

      // With extension, CRC and GAP#3 are in the floppy
      for (unsigned int k = 0; k < 0x200; k++)
      {
         load_disk_index = IDisk::AddByteWithCrc(track_buffer, load_disk_index, 0xE5, crc);
      }

      // - Crc (2 bytes) - If needed....
      computed_crc = crc.GetCRC();
      load_disk_index = IDisk::AddByteWithoutCrc(track_buffer, load_disk_index, (computed_crc >> 8));
      load_disk_index = IDisk::AddByteWithoutCrc(track_buffer, load_disk_index, (computed_crc & 0xFF));

      // - GAP #3 (x bytes)
      for (j = 0; j < 78; j++)
      {
         load_disk_index = IDisk::AddByteWithoutCrc(track_buffer, load_disk_index, 0x4E);
      }
   }
   // End of track
   for (; load_disk_index < 6250 * 16 - 15;)
   {
      load_disk_index = IDisk::AddByteWithoutCrc(track_buffer, load_disk_index, 0x4E);
   }

   for (; load_disk_index < static_cast<int>(sizeOftrack); load_disk_index++)
   {
      track_buffer[load_disk_index] = BIT_WEAK;
   }
}